

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

int __thiscall
CConsole::RegisterPrintCallback
          (CConsole *this,int OutputLevel,FPrintCallback pfnPrintCallback,void *pUserData)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  iVar1 = this->m_NumPrintCB;
  lVar3 = (long)iVar1;
  iVar2 = -1;
  if (lVar3 != 4) {
    iVar2 = 2;
    if ((uint)OutputLevel < 2) {
      iVar2 = OutputLevel;
    }
    iVar4 = 0;
    if (-1 < OutputLevel) {
      iVar4 = iVar2;
    }
    this->m_aPrintCB[lVar3].m_OutputLevel = iVar4;
    this->m_aPrintCB[lVar3].m_pfnPrintCallback = pfnPrintCallback;
    this->m_aPrintCB[lVar3].m_pPrintCallbackUserdata = pUserData;
    this->m_NumPrintCB = iVar1 + 1;
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int CConsole::RegisterPrintCallback(int OutputLevel, FPrintCallback pfnPrintCallback, void *pUserData)
{
	if(m_NumPrintCB == MAX_PRINT_CB)
		return -1;

	m_aPrintCB[m_NumPrintCB].m_OutputLevel = clamp(OutputLevel, (int)(OUTPUT_LEVEL_STANDARD), (int)(OUTPUT_LEVEL_DEBUG));
	m_aPrintCB[m_NumPrintCB].m_pfnPrintCallback = pfnPrintCallback;
	m_aPrintCB[m_NumPrintCB].m_pPrintCallbackUserdata = pUserData;
	return m_NumPrintCB++;
}